

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall lunasvg::SVGString::parse(SVGString *this,string_view input)

{
  SVGString *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGString *)input._M_len;
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_value,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  return true;
}

Assistant:

bool SVGString::parse(std::string_view input)
{
    stripLeadingAndTrailingSpaces(input);
    m_value.assign(input);
    return true;
}